

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.h
# Opt level: O0

void __thiscall
llvm::dwarf::CIE::CIE
          (CIE *this,uint64_t Offset,uint64_t Length,uint8_t Version,SmallString<8U> *Augmentation,
          uint8_t AddressSize,uint8_t SegmentDescriptorSize,uint64_t CodeAlignmentFactor,
          int64_t DataAlignmentFactor,uint64_t ReturnAddressRegister,
          SmallString<8U> *AugmentationData,uint32_t FDEPointerEncoding,uint32_t LSDAPointerEncoding
          ,Optional<unsigned_long> Personality,Optional<unsigned_int> PersonalityEnc,ArchType Arch)

{
  uint8_t AddressSize_local;
  SmallString<8U> *Augmentation_local;
  uint8_t Version_local;
  uint64_t Length_local;
  uint64_t Offset_local;
  CIE *this_local;
  Optional<unsigned_int> PersonalityEnc_local;
  
  FrameEntry::FrameEntry
            (&this->super_FrameEntry,FK_CIE,Offset,Length,CodeAlignmentFactor,DataAlignmentFactor,
             Arch);
  (this->super_FrameEntry)._vptr_FrameEntry = (_func_int **)&PTR__CIE_030a3be0;
  this->Version = Version;
  SmallString<8U>::SmallString(&this->Augmentation,Augmentation);
  this->AddressSize = AddressSize;
  this->SegmentDescriptorSize = SegmentDescriptorSize;
  this->CodeAlignmentFactor = CodeAlignmentFactor;
  this->DataAlignmentFactor = DataAlignmentFactor;
  this->ReturnAddressRegister = ReturnAddressRegister;
  SmallString<8U>::SmallString(&this->AugmentationData,AugmentationData);
  this->FDEPointerEncoding = FDEPointerEncoding;
  this->LSDAPointerEncoding = LSDAPointerEncoding;
  (this->Personality).Storage.field_0 = Personality.Storage.field_0;
  (this->Personality).Storage.hasVal = Personality.Storage.hasVal;
  *(undefined7 *)&(this->Personality).Storage.field_0x9 = Personality.Storage._9_7_;
  (this->PersonalityEnc).Storage = PersonalityEnc.Storage;
  return;
}

Assistant:

CIE(uint64_t Offset, uint64_t Length, uint8_t Version,
      SmallString<8> Augmentation, uint8_t AddressSize,
      uint8_t SegmentDescriptorSize, uint64_t CodeAlignmentFactor,
      int64_t DataAlignmentFactor, uint64_t ReturnAddressRegister,
      SmallString<8> AugmentationData, uint32_t FDEPointerEncoding,
      uint32_t LSDAPointerEncoding, Optional<uint64_t> Personality,
      Optional<uint32_t> PersonalityEnc, Triple::ArchType Arch)
      : FrameEntry(FK_CIE, Offset, Length, CodeAlignmentFactor,
                   DataAlignmentFactor, Arch),
        Version(Version), Augmentation(std::move(Augmentation)),
        AddressSize(AddressSize), SegmentDescriptorSize(SegmentDescriptorSize),
        CodeAlignmentFactor(CodeAlignmentFactor),
        DataAlignmentFactor(DataAlignmentFactor),
        ReturnAddressRegister(ReturnAddressRegister),
        AugmentationData(std::move(AugmentationData)),
        FDEPointerEncoding(FDEPointerEncoding),
        LSDAPointerEncoding(LSDAPointerEncoding), Personality(Personality),
        PersonalityEnc(PersonalityEnc) {}